

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O0

bool anon_unknown.dwarf_16af90::checkPixels<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,Array2D<Imath_3_2::half_*> *ph,int width,
               int height)

{
  bool bVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  Array2D<Imath_3_2::half_*> *unaff_retaddr;
  Array2D<unsigned_int> *in_stack_00000008;
  
  bVar1 = checkPixels<Imath_3_2::half>
                    (in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                     (int)((ulong)in_RSI >> 0x20),(int)in_RSI,(int)sampleCount);
  return bVar1;
}

Assistant:

bool
checkPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    return checkPixels<T> (sampleCount, ph, 0, width - 1, 0, height - 1, width);
}